

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

bool __thiscall Catch::TestSpecParser::isControlChar(TestSpecParser *this,char c)

{
  bool bVar1;
  
  switch(this->m_mode) {
  case None:
    bVar1 = c == '~';
    break;
  case Name:
    bVar1 = c == '[';
    break;
  case QuotedName:
    bVar1 = c == '\"';
    break;
  case Tag:
    bVar1 = (c + 0xa5U & 0xfd) == 0;
    break;
  case EscapedName:
    return true;
  default:
    return false;
  }
  return bVar1;
}

Assistant:

bool TestSpecParser::isControlChar( char c ) const {
        switch( m_mode ) {
            default:
                return false;
            case None:
                return c == '~';
            case Name:
                return c == '[';
            case EscapedName:
                return true;
            case QuotedName:
                return c == '"';
            case Tag:
                return c == '[' || c == ']';
        }
    }